

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void auto_arima_predict(auto_arima_object obj,double *inp,double *xreg,int L,double *newxreg,
                       double *xpred,double *amse)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int d;
  int N;
  int D;
  int iVar6;
  uint uVar7;
  double *pdVar8;
  uint ip;
  int id;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  int iVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double *local_b8;
  
  uVar1 = obj->p;
  uVar2 = obj->q;
  uVar3 = obj->P;
  uVar4 = obj->Q;
  iVar5 = obj->s;
  lVar18 = (long)iVar5;
  ip = iVar5 * uVar3 + uVar1;
  uVar10 = uVar4 * iVar5 + uVar2 + 1;
  if ((int)uVar10 < (int)ip) {
    uVar10 = ip;
  }
  d = obj->d;
  N = obj->N;
  lVar11 = (long)N;
  D = obj->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar17 = iVar5 * D;
  C_00 = (double *)malloc((long)iVar17 * 8 + 8);
  id = d + iVar17;
  oup = (double *)malloc((long)id * 8 + 8);
  W = (double *)malloc(lVar11 * 8);
  resid = (double *)malloc(lVar11 * 8);
  iVar6 = obj->idrift;
  phi = (double *)malloc((long)(int)uVar10 << 3);
  theta = (double *)malloc((long)(int)uVar10 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  dVar19 = 0.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    dVar19 = obj->mean;
  }
  if (0 < d) {
    deld(d,C);
  }
  if (0 < D) {
    delds(D,iVar5,C_00);
  }
  conv(C,d + 1,C_00,iVar17 + 1,oup);
  if (0 < id) {
    uVar12 = 1;
    do {
      oup[uVar12] = -oup[uVar12];
      uVar12 = uVar12 + 1;
    } while (d + iVar17 + 1 != uVar12);
  }
  if (0 < N) {
    iVar17 = obj->idrift;
    uVar7 = obj->r;
    pdVar8 = obj->res;
    lVar9 = 0;
    local_b8 = xreg;
    do {
      dVar20 = inp[lVar9];
      if (D == 0 && d == 0) {
        dVar20 = dVar20 - dVar19;
      }
      W[lVar9] = dVar20;
      if (iVar17 == 1) {
        W[lVar9] = dVar20 - (double)((int)lVar9 + 1) * *obj->exog;
      }
      if ((int)(uint)(iVar6 == 1) < (int)uVar7 && 0 < (int)uVar7) {
        pdVar16 = obj->exog;
        dVar20 = W[lVar9];
        pdVar15 = local_b8;
        uVar12 = (ulong)(iVar6 == 1);
        do {
          dVar20 = dVar20 - pdVar16[uVar12] * *pdVar15;
          W[lVar9] = dVar20;
          uVar12 = uVar12 + 1;
          pdVar15 = pdVar15 + lVar11;
        } while (uVar7 != uVar12);
      }
      resid[lVar9] = pdVar8[lVar9];
      lVar9 = lVar9 + 1;
      local_b8 = local_b8 + 1;
    } while (lVar9 != lVar11);
  }
  if (0 < (int)uVar10) {
    memset(theta,0,(ulong)uVar10 << 3);
    memset(phi,0,(ulong)uVar10 << 3);
  }
  if (0 < (int)uVar1) {
    pdVar8 = obj->phi;
    uVar12 = 0;
    do {
      phi[uVar12] = pdVar8[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar1 != uVar12);
  }
  if (0 < (int)uVar2) {
    pdVar8 = obj->theta;
    uVar12 = 0;
    do {
      theta[uVar12] = -pdVar8[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar2 != uVar12);
  }
  if (0 < (int)uVar3) {
    pdVar8 = obj->PHI;
    uVar12 = 0;
    pdVar16 = phi;
    do {
      pdVar16 = pdVar16 + lVar18;
      uVar13 = uVar12 + 1;
      phi[uVar13 * lVar18 + -1] = pdVar8[uVar12] + phi[uVar13 * lVar18 + -1];
      if (0 < (int)uVar1) {
        pdVar15 = obj->phi;
        uVar14 = 0;
        do {
          pdVar16[uVar14] = pdVar16[uVar14] - pdVar15[uVar14] * pdVar8[uVar12];
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
      uVar12 = uVar13;
    } while (uVar13 != uVar3);
  }
  if (0 < (int)uVar4) {
    pdVar8 = obj->THETA;
    uVar12 = 0;
    pdVar16 = theta;
    do {
      pdVar16 = pdVar16 + lVar18;
      uVar13 = uVar12 + 1;
      theta[uVar13 * lVar18 + -1] = theta[uVar13 * lVar18 + -1] - pdVar8[uVar12];
      if (0 < (int)uVar2) {
        pdVar15 = obj->theta;
        uVar14 = 0;
        do {
          pdVar16[uVar14] = pdVar15[uVar14] * pdVar8[uVar12] + pdVar16[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar2 != uVar14);
      }
      uVar12 = uVar13;
    } while (uVar13 != uVar4);
  }
  forkal(ip,uVar4 * iVar5 + uVar2,id,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  if (0 < L) {
    uVar1 = obj->r;
    iVar5 = obj->idrift;
    uVar12 = 0;
    do {
      dVar20 = xpred[uVar12];
      xpred[uVar12] = dVar20 + dVar19;
      if (iVar5 == 1) {
        xpred[uVar12] = (double)(N + 1 + (int)uVar12) * *obj->exog + dVar20 + dVar19;
      }
      if ((int)(uint)(iVar6 == 1) < (int)uVar1) {
        pdVar8 = obj->exog;
        dVar20 = xpred[uVar12];
        pdVar16 = newxreg;
        uVar13 = (ulong)(iVar6 == 1);
        do {
          dVar20 = dVar20 + pdVar8[uVar13] * *pdVar16;
          xpred[uVar12] = dVar20;
          uVar13 = uVar13 + 1;
          pdVar16 = pdVar16 + (uint)L;
        } while (uVar1 != uVar13);
      }
      uVar12 = uVar12 + 1;
      newxreg = newxreg + 1;
    } while (uVar12 != (uint)L);
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void auto_arima_predict(auto_arima_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j,diter;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	p = obj->p;
	q = obj->q;
	D = obj->D;
	P = obj->P;
	Q = obj->Q;
	s = obj->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	diter = 0;

	if (obj->idrift == 1) {
		diter = 1;		
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		if (obj->idrift == 1) {
			W[i] -= obj->exog[0]*(i+1);
		}
		if (obj->r > 0) {
			for(j = diter; j < obj->r;++j) {
				W[i] -= obj->exog[j] * xreg[(j-diter)*N+i];
			}
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->phi[i] * obj->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->theta[i] * obj->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
		if (obj->idrift == 1) {
			xpred[i] += obj->exog[0]*(i+1+N);
		}
		for(j = diter; j < obj->r;++j) {
			xpred[i] += obj->exog[j] * newxreg[(j - diter)*L+i];
		}
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}